

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void test_request_permission_callback(ne_core_permission_event *event,void *user_data)

{
  ne_core_permission_state nVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  int64_t iVar4;
  uint64_t uVar5;
  byte bVar6;
  bool bVar7;
  
  uVar5 = event->permission;
  uVar2 = *(uint64_t *)((long)user_data + 8);
  if (uVar5 != uVar2) {
    (*ne_core_error)((uint64_t *)0x0,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                     ,0x21d,"TEST_EXPECT(event->permission == table->permission) failed\n");
  }
  bVar6 = uVar5 == uVar2 & *(byte *)((long)user_data + 0x48);
  *(byte *)((long)user_data + 0x48) = bVar6;
  if (event->current_state == ne_core_permission_state_prompt) {
    bVar6 = 0;
    (*ne_core_error)((uint64_t *)0x0,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                     ,0x21e,
                     "TEST_EXPECT(event->current_state != ne_core_permission_state_prompt) failed\n"
                    );
  }
  *(byte *)((long)user_data + 0x48) = bVar6;
  nVar1 = event->previous_state;
  if (nVar1 != ne_core_permission_state_prompt) {
    (*ne_core_error)((uint64_t *)0x0,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                     ,0x21f,
                     "TEST_EXPECT(event->previous_state == ne_core_permission_state_prompt) failed\n"
                    );
    bVar6 = *(byte *)((long)user_data + 0x48);
  }
  bVar6 = nVar1 == ne_core_permission_state_prompt & bVar6;
  *(byte *)((long)user_data + 0x48) = bVar6;
  if (event->current_state == ne_core_permission_state_denied) {
LAB_00108f5f:
    *(byte *)((long)user_data + 0x48) = bVar6;
    puVar3 = *(uint64_t **)((long)user_data + 0x40);
    if (puVar3 != (uint64_t *)0x0) {
      *puVar3 = 0;
    }
    (*ne_core_query_permission)
              (puVar3,*(uint64_t *)((long)user_data + 8),test_query_permission_denied_callback,
               user_data);
    if (*(uint64_t **)((long)user_data + 0x40) == (uint64_t *)0x0) {
      return;
    }
    uVar5 = **(uint64_t **)((long)user_data + 0x40);
    bVar7 = uVar5 == 1;
    if (bVar7) goto LAB_00108fbe;
    iVar4 = 0x235;
  }
  else {
    if (event->current_state != ne_core_permission_state_granted) {
      bVar6 = 0;
      (*ne_core_error)((uint64_t *)0x0,0,
                       "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                       ,0x22d,
                       "TEST_EXPECT(event->current_state == ne_core_permission_state_denied) failed\n"
                      );
      goto LAB_00108f5f;
    }
    puVar3 = *(uint64_t **)((long)user_data + 0x40);
    if (puVar3 != (uint64_t *)0x0) {
      *puVar3 = 0;
    }
    (*ne_core_query_permission)
              (puVar3,*(uint64_t *)((long)user_data + 8),test_query_permission_granted_callback,
               user_data);
    if (*(uint64_t **)((long)user_data + 0x40) == (uint64_t *)0x0) {
      return;
    }
    uVar5 = **(uint64_t **)((long)user_data + 0x40);
    bVar7 = uVar5 == 1;
    if (bVar7) goto LAB_00108fbe;
    iVar4 = 0x229;
  }
  (*ne_core_error)((uint64_t *)0x0,uVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                   ,iVar4,"TEST_EXPECT_RESULT(NE_CORE_RESULT_SUCCESS) failed\n");
LAB_00108fbe:
  *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar7;
  return;
}

Assistant:

static void test_request_permission_callback(
    const ne_core_permission_event *event, const void *user_data)
{
  auto table = static_cast<test_table *>(const_cast<void *>(user_data));
  TEST_EXPECT(event->permission == table->permission);
  TEST_EXPECT(event->current_state != ne_core_permission_state_prompt);
  TEST_EXPECT(event->previous_state == ne_core_permission_state_prompt);

  if (event->current_state == ne_core_permission_state_granted)
  {
    // We SHOULD have permission.
    TEST_CLEAR_RESULT();
    ne_core_query_permission(table->result,
                             table->permission,
                             &test_query_permission_granted_callback,
                             table);
    TEST_EXPECT_RESULT(NE_CORE_RESULT_SUCCESS);
  }
  else
  {
    TEST_EXPECT(event->current_state == ne_core_permission_state_denied);

    // We SHOULD NOT have permission.
    TEST_CLEAR_RESULT();
    ne_core_query_permission(table->result,
                             table->permission,
                             &test_query_permission_denied_callback,
                             table);
    TEST_EXPECT_RESULT(NE_CORE_RESULT_SUCCESS);
  }
}